

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O1

void vera::setMouseVisibility(bool _visible)

{
  undefined7 in_register_00000039;
  
  glfwSetInputMode(window,0x33001,0x34002 - (int)CONCAT71(in_register_00000039,_visible));
  return;
}

Assistant:

void    setMouseVisibility(bool _visible) {
    #if defined(DRIVER_GLFW)
    if (_visible)
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
    else
        glfwSetInputMode(window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
    
    #endif
}